

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall vmdict_TrieNode::add_word(vmdict_TrieNode *this,char *str,size_t len)

{
  vmdict_TrieNode *pvVar1;
  wchar_t wVar2;
  vmdict_TrieNode **ppvVar3;
  vmdict_TrieNode **ppvVar4;
  utf8_ptr p;
  size_t len_local;
  
  p.p_ = str;
  len_local = len;
  do {
    if (len_local == 0) {
      this->word_cnt = this->word_cnt + 1;
      return;
    }
    wVar2 = utf8_ptr::s_getch(p.p_);
    ppvVar3 = &this->chi;
    ppvVar4 = ppvVar3;
    while (this = *ppvVar4, this != (vmdict_TrieNode *)0x0) {
      if (this->ch == wVar2) goto LAB_0023e3d5;
      ppvVar4 = &this->nxt;
    }
    this = (vmdict_TrieNode *)operator_new(0x18);
    pvVar1 = *ppvVar3;
    this->ch = wVar2;
    this->word_cnt = 0;
    this->nxt = pvVar1;
    this->chi = (vmdict_TrieNode *)0x0;
    *ppvVar3 = this;
LAB_0023e3d5:
    utf8_ptr::inc(&p,&len_local);
  } while( true );
}

Assistant:

void vmdict_TrieNode::add_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if there's no existing child for this letter, add one */
        if (chi == 0)
            n->chi = chi = new vmdict_TrieNode(n->chi, ch);

        /* advance to this child node */
        n = chi;
    }

    /* 'n' is the final node for this word, so count the word there */
    n->word_cnt += 1;
}